

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

_Bool enum_dir_next(DIR *dp,int index,strbuf *out)

{
  BinarySink *bs;
  uchar val;
  uchar uVar1;
  uchar uVar2;
  size_t new_len;
  int iVar3;
  strbuf *buf;
  char *pcVar4;
  dirent *pdVar5;
  char cVar6;
  char cVar7;
  ptrlen pVar8;
  stat st;
  
  if (dp == (DIR *)0x0) {
    return false;
  }
  buf = strbuf_new();
  pcVar4 = make_filename(index,(char *)0x0);
  bs = buf->binarysink_;
  pVar8 = ptrlen_from_asciz(pcVar4);
  BinarySink_put_datapl(bs,pVar8);
  safefree(pcVar4);
  BinarySink_put_byte(bs,'/');
  new_len = buf->len;
  do {
    pdVar5 = readdir((DIR *)dp);
    if (pdVar5 == (dirent *)0x0) goto LAB_00118b94;
    strbuf_shrink_to(buf,new_len);
    pcVar4 = pdVar5->d_name;
    pVar8 = ptrlen_from_asciz(pcVar4);
    BinarySink_put_datapl(bs,pVar8);
    iVar3 = stat(buf->s,(stat *)&st);
  } while ((iVar3 < 0) || ((st.st_mode & 0xf000) != 0x8000));
  do {
    for (; val = *pcVar4, val != '%'; pcVar4 = pcVar4 + 1) {
      if (val == '\0') {
LAB_00118b94:
        strbuf_free(buf);
        return pdVar5 != (dirent *)0x0;
      }
LAB_00118b83:
      BinarySink_put_byte(out->binarysink_,val);
    }
    uVar1 = pcVar4[1];
    if ((uVar1 == '\0') || (uVar2 = pcVar4[2], uVar2 == '\0')) goto LAB_00118b83;
    cVar6 = '9';
    if ((char)uVar1 < ':') {
      cVar6 = '\0';
    }
    cVar7 = -7;
    if ((char)uVar2 < ':') {
      cVar7 = '\0';
    }
    BinarySink_put_byte(out->binarysink_,uVar2 + cVar7 + (cVar6 + uVar1) * '\x10' + 0xd0);
    pcVar4 = pcVar4 + 3;
  } while( true );
}

Assistant:

static bool enum_dir_next(DIR *dp, int index, strbuf *out)
{
    struct dirent *de;
    struct stat st;
    strbuf *fullpath;

    if (!dp)
        return false;

    fullpath = strbuf_new();

    char *sessiondir = make_filename(index, NULL);
    put_dataz(fullpath, sessiondir);
    sfree(sessiondir);
    put_byte(fullpath, '/');

    size_t baselen = fullpath->len;

    while ( (de = readdir(dp)) != NULL ) {
        strbuf_shrink_to(fullpath, baselen);
        put_dataz(fullpath, de->d_name);

        if (stat(fullpath->s, &st) < 0 || !S_ISREG(st.st_mode))
            continue;                  /* try another one */

        decode_session_filename(de->d_name, out);
        strbuf_free(fullpath);
        return true;
    }

    strbuf_free(fullpath);
    return false;
}